

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<float,_4> __thiscall
tcu::select<float,4>
          (tcu *this,Vector<float,_4> *trueVal,Vector<float,_4> *falseVal,Vector<bool,_4> *cond)

{
  bool *pbVar1;
  float *pfVar2;
  ulong extraout_XMM0_Qa;
  ulong uVar3;
  undefined8 in_XMM1_Qa;
  Vector<float,_4> VVar4;
  undefined4 local_44;
  undefined4 local_2c;
  int i;
  Vector<bool,_4> *cond_local;
  Vector<float,_4> *falseVal_local;
  Vector<float,_4> *trueVal_local;
  Vector<float,_4> *res;
  
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  uVar3 = extraout_XMM0_Qa;
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    pbVar1 = Vector<bool,_4>::operator[](cond,local_2c);
    if ((*pbVar1 & 1U) == 0) {
      pfVar2 = Vector<float,_4>::operator[](falseVal,local_2c);
      local_44 = *pfVar2;
    }
    else {
      pfVar2 = Vector<float,_4>::operator[](trueVal,local_2c);
      local_44 = *pfVar2;
    }
    pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)this,local_2c);
    uVar3 = (ulong)(uint)local_44;
    *pfVar2 = local_44;
  }
  VVar4.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar4.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  VVar4.m_data[0] = (float)(int)uVar3;
  VVar4.m_data[1] = (float)(int)(uVar3 >> 0x20);
  return (Vector<float,_4>)VVar4.m_data;
}

Assistant:

inline Vector<T, Size> select (const Vector<T, Size>& trueVal, const Vector<T, Size>& falseVal, const Vector<bool, Size>& cond)
{
	Vector<T, Size> res;
	for (int i = 0; i < Size; i++)
		res[i] = cond[i] ? trueVal[i] : falseVal[i];
	return res;
}